

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_cmpxchg16b_x86_64(CPUX86State *env,target_ulong a0)

{
  Int128 *addr;
  target_ulong tVar1;
  undefined1 cmpv [16];
  undefined1 newv [16];
  uint32_t uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  Int128 *pIVar4;
  target_ulong extraout_RDX;
  undefined8 unaff_RBX;
  uint uVar5;
  uintptr_t unaff_retaddr;
  
  if ((a0 & 0xf) == 0) {
    uVar2 = cpu_cc_compute_all_x86_64(env,env->cc_op);
    addr = (Int128 *)env->regs[0];
    tVar1 = env->regs[2];
    uVar3 = 0x431;
    if (((~env->hflags & 3) != 0) && (uVar3 = 0x432, (env->hflags >> 0x17 & 1) != 0)) {
      uVar3 = (ulong)((uint)env->eflags >> 0x11 & 2 | 0x430);
    }
    cmpv._8_8_ = unaff_retaddr;
    cmpv._0_8_ = uVar3;
    newv._8_8_ = unaff_RBX;
    newv._0_8_ = in_RAX;
    pIVar4 = helper_atomic_cmpxchgo_le_mmu_x86_64
                       ((Int128 *)env,(CPUArchState *)a0,(target_ulong)addr,(Int128)cmpv,
                        (Int128)newv,(TCGMemOpIdx)tVar1,env->regs[3]);
    if (addr == pIVar4 && tVar1 == extraout_RDX) {
      uVar5 = uVar2 | 0x40;
    }
    else {
      env->regs[0] = (target_ulong)pIVar4;
      env->regs[2] = extraout_RDX;
      uVar5 = uVar2 & 0xffffffbf;
    }
    env->cc_src = (long)(int)uVar5;
    return;
  }
  raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
}

Assistant:

void helper_cmpxchg16b(CPUX86State *env, target_ulong a0)
{
    uintptr_t ra = GETPC();

    if ((a0 & 0xf) != 0) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    } else if (HAVE_CMPXCHG128) {
        int eflags = cpu_cc_compute_all(env, CC_OP);

        Int128 cmpv = int128_make128(env->regs[R_EAX], env->regs[R_EDX]);
        Int128 newv = int128_make128(env->regs[R_EBX], env->regs[R_ECX]);

        int mem_idx = cpu_mmu_index(env, false);
        TCGMemOpIdx oi = make_memop_idx(MO_TEQ | MO_ALIGN_16, mem_idx);
        Int128 oldv = helper_atomic_cmpxchgo_le_mmu(env, a0, cmpv,
                                                    newv, oi, ra);

        if (int128_eq(oldv, cmpv)) {
            eflags |= CC_Z;
        } else {
            env->regs[R_EAX] = int128_getlo(oldv);
            env->regs[R_EDX] = int128_gethi(oldv);
            eflags &= ~CC_Z;
        }
        CC_SRC = eflags;
    } else {
        cpu_loop_exit_atomic(env_cpu(env), ra);
    }
}